

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O1

int Aig_TsiStateLookup(Aig_Tsi_t *p,uint *pState,int nWords)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint *__s1;
  
  uVar1 = 0;
  if (0 < nWords) {
    uVar3 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 ^ Aig_TsiStateHash::s_FPrimes[(uint)uVar3 & 0x7f] * pState[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)nWords != uVar3);
  }
  __s1 = p->pBins[(int)(uVar1 % (uint)p->nBins)];
  if (__s1 != (uint *)0x0) {
    do {
      iVar2 = bcmp(__s1,pState,(long)nWords * 4);
      if (iVar2 == 0) {
        return 1;
      }
      __s1 = *(uint **)(__s1 + nWords);
    } while (__s1 != (uint *)0x0);
  }
  return 0;
}

Assistant:

int Aig_TsiStateLookup( Aig_Tsi_t * p, unsigned * pState, int nWords )
{
    unsigned * pEntry;
    int Hash;
    Hash = Aig_TsiStateHash( pState, nWords, p->nBins );
    for ( pEntry = p->pBins[Hash]; pEntry; pEntry = Aig_TsiNext(pEntry, nWords) )
        if ( !memcmp( pEntry, pState, sizeof(unsigned) * nWords ) )
            return 1;
    return 0;
}